

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ColorTooltip(char *text,float *col,ImGuiColorEditFlags flags)

{
  ImGuiWindow *pIVar1;
  ImVec2 size;
  ImGuiContext *pIVar2;
  char *text_end;
  float fVar3;
  ImVec4 local_38;
  
  pIVar2 = GImGui;
  BeginTooltipEx(0,true);
  text_end = text;
  if ((char *)0x1 < text + 1) {
    do {
      if (*text_end == '#') {
        if (text_end[1] == '#') goto LAB_00195e93;
      }
      else if (*text_end == '\0') goto LAB_00195e93;
      text_end = text_end + 1;
    } while (text_end != (char *)0xffffffffffffffff);
    text_end = (char *)0xffffffffffffffff;
LAB_00195e93:
    if (text < text_end) {
      TextUnformatted(text,text_end);
      Separator();
    }
  }
  fVar3 = (pIVar2->Style).FramePadding.y;
  fVar3 = pIVar2->FontSize * 3.0 + fVar3 + fVar3;
  local_38.x = col[0];
  local_38.y = col[1];
  local_38.z = col[2];
  local_38.w = col[3];
  size.y = fVar3;
  size.x = fVar3;
  ColorButton("##preview",&local_38,flags & 0x60002U | 0x40,size);
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    (pIVar1->DC).CursorPos.x = (pIVar2->Style).ItemSpacing.x + (pIVar1->DC).CursorPosPrevLine.x;
    (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
    (pIVar1->DC).CurrentLineHeight = (pIVar1->DC).PrevLineHeight;
    (pIVar1->DC).CurrentLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
  }
  if ((flags & 2U) == 0) {
    Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)",SUB84((double)*col,0)
         ,SUB84((double)col[1],0),(double)col[2],(double)col[3]);
  }
  else {
    Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)",SUB84((double)*col,0),
         SUB84((double)col[1],0),(double)col[2]);
  }
  EndTooltip();
  return;
}

Assistant:

void ImGui::ColorTooltip(const char* text, const float* col, ImGuiColorEditFlags flags)
{
    ImGuiContext& g = *GImGui;

    int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
    BeginTooltipEx(0, true);

    const char* text_end = text ? FindRenderedTextEnd(text, NULL) : text;
    if (text_end > text)
    {
        TextUnformatted(text, text_end);
        Separator();
    }

    ImVec2 sz(g.FontSize * 3 + g.Style.FramePadding.y * 2, g.FontSize * 3 + g.Style.FramePadding.y * 2);
    ColorButton("##preview", ImVec4(col[0], col[1], col[2], col[3]), (flags & (ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf)) | ImGuiColorEditFlags_NoTooltip, sz);
    SameLine();
    if (flags & ImGuiColorEditFlags_NoAlpha)
        Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)", cr, cg, cb, cr, cg, cb, col[0], col[1], col[2]);
    else
        Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)", cr, cg, cb, ca, cr, cg, cb, ca, col[0], col[1], col[2], col[3]);
    EndTooltip();
}